

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debug_Utilities.cpp
# Opt level: O0

void Nova::Function_Is_Not_Defined(char *function,char *file,uint line,type_info *type)

{
  char *pcVar1;
  ostream *poVar2;
  runtime_error *this;
  allocator local_49;
  string local_48 [8];
  string error;
  type_info *type_local;
  uint line_local;
  char *file_local;
  char *function_local;
  
  pcVar1 = std::type_info::name(type);
  sprintf(Function_Is_Not_Defined::buffer,"%s:%s:%d: Function not defined by %s",file,function,
          (ulong)line,pcVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,Function_Is_Not_Defined::buffer,&local_49);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  std::ostream::operator<<(Log::(anonymous_namespace)::cout,std::flush<char,std::char_traits<char>>)
  ;
  std::operator<<(Log::(anonymous_namespace)::cerr,"\n");
  poVar2 = std::operator<<(Log::(anonymous_namespace)::cerr,"\n*** ERROR: ");
  poVar2 = std::operator<<(poVar2,local_48);
  poVar2 = std::operator<<(poVar2,'\n');
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,local_48);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Nova::Function_Is_Not_Defined(const char* function,const char* file,unsigned int line,const std::type_info& type)
{
    static char buffer[2048];
    sprintf(buffer,"%s:%s:%d: Function not defined by %s",file,function,line,type.name());
    std::string error(buffer);
    Log::cout<<std::flush;Log::cerr<<"\n";
    Log::cerr<<"\n*** ERROR: "<<error<<'\n'<<std::endl;
    throw std::runtime_error(error);
}